

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

dxt_image * __thiscall crnlib::dxt_image::operator=(dxt_image *this,dxt_image *rhs)

{
  uint uVar1;
  uint min_new_capacity;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  element *__src;
  
  if (this != rhs) {
    clear(this);
    uVar2 = rhs->m_height;
    uVar3 = rhs->m_blocks_x;
    uVar4 = rhs->m_blocks_y;
    this->m_width = rhs->m_width;
    this->m_height = uVar2;
    this->m_blocks_x = uVar3;
    this->m_blocks_y = uVar4;
    this->m_format = rhs->m_format;
    min_new_capacity = rhs->m_total_elements;
    uVar2 = rhs->m_num_elements_per_block;
    uVar3 = rhs->m_bytes_per_block;
    this->m_total_blocks = rhs->m_total_blocks;
    this->m_total_elements = min_new_capacity;
    this->m_num_elements_per_block = uVar2;
    this->m_bytes_per_block = uVar3;
    this->m_pElements = (element *)0x0;
    *(undefined8 *)this->m_element_type = *(undefined8 *)rhs->m_element_type;
    *(undefined2 *)this->m_element_component_index = *(undefined2 *)rhs->m_element_component_index;
    __src = rhs->m_pElements;
    if (__src != (element *)0x0) {
      uVar1 = (this->m_elements).m_size;
      uVar5 = min_new_capacity;
      if (uVar1 != min_new_capacity) {
        if ((uVar1 <= min_new_capacity) && ((this->m_elements).m_capacity < min_new_capacity)) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this,min_new_capacity,uVar1 + 1 == min_new_capacity,8,
                     (object_mover)0x0,false);
          __src = rhs->m_pElements;
          uVar5 = this->m_total_elements;
        }
        (this->m_elements).m_size = min_new_capacity;
      }
      memcpy((this->m_elements).m_p,__src,(ulong)uVar5 << 3);
      this->m_pElements = (this->m_elements).m_p;
    }
  }
  return this;
}

Assistant:

dxt_image& dxt_image::operator=(const dxt_image& rhs)
    {
        if (this == &rhs)
        {
            return *this;
        }

        clear();

        m_width = rhs.m_width;
        m_height = rhs.m_height;
        m_blocks_x = rhs.m_blocks_x;
        m_blocks_y = rhs.m_blocks_y;
        m_num_elements_per_block = rhs.m_num_elements_per_block;
        m_bytes_per_block = rhs.m_bytes_per_block;
        m_format = rhs.m_format;
        m_total_blocks = rhs.m_total_blocks;
        m_total_elements = rhs.m_total_elements;
        m_pElements = nullptr;
        memcpy(m_element_type, rhs.m_element_type, sizeof(m_element_type));
        memcpy(m_element_component_index, rhs.m_element_component_index, sizeof(m_element_component_index));

        if (rhs.m_pElements)
        {
            m_elements.resize(m_total_elements);
            memcpy(&m_elements[0], rhs.m_pElements, sizeof(element) * m_total_elements);
            m_pElements = &m_elements[0];
        }

        return *this;
    }